

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall QXmlStreamReaderPrivate::putReplacement(QXmlStreamReaderPrivate *this,QStringView s)

{
  ushort uVar1;
  long lVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  const_reverse_iterator end;
  long lVar6;
  long lVar7;
  
  lVar7 = s.m_size;
  lVar2 = (this->putStack).tos + lVar7;
  lVar4 = (this->putStack).cap;
  if (lVar4 <= lVar2) {
    lVar2 = lVar2 + 1;
    lVar6 = lVar4 * 2;
    if (lVar2 != lVar6 && SBORROW8(lVar2,lVar6) == lVar2 + lVar4 * -2 < 0) {
      lVar6 = lVar2;
    }
    (this->putStack).cap = lVar6;
    puVar3 = (uint *)realloc((this->putStack).data,lVar6 << 2);
    (this->putStack).data = puVar3;
    if (puVar3 == (uint *)0x0) {
      qBadAlloc();
    }
  }
  if (lVar7 != 0) {
    puVar3 = (this->putStack).data;
    lVar4 = (this->putStack).tos;
    lVar7 = lVar7 * 2;
    do {
      uVar1 = *(ushort *)((long)s.m_data + lVar7 + -2);
      uVar5 = (uint)uVar1;
      if ((uVar1 == 0xd) || (uVar1 == 10)) {
        uVar5 = uVar1 | 0x1a0000;
      }
      puVar3[lVar4 + 1] = uVar5;
      lVar4 = lVar4 + 1;
      lVar7 = lVar7 + -2;
    } while (lVar7 != 0);
    (this->putStack).tos = lVar4;
  }
  return;
}

Assistant:

void QXmlStreamReaderPrivate::putReplacement(QStringView s)
{
    putStack.reserve(s.size());
    for (auto it = s.rbegin(), end = s.rend(); it != end; ++it) {
        char16_t c = it->unicode();
        if (c == '\n' || c == '\r')
            putStack.rawPush() = ((LETTER << 16) | c);
        else
            putStack.rawPush() = c;
    }
}